

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tester.c
# Opt level: O0

int main(void)

{
  uint uVar1;
  FILE *pFVar2;
  uint *puVar3;
  int *piVar4;
  char *pcVar5;
  undefined1 local_410 [8];
  tester_mq_msg tester_msg;
  
  tester_msg._1020_4_ = 0;
  main_pid = getpid();
  setup_sig_handlers(&err);
  pFVar2 = _stderr;
  if ((err & 1U) != 0) {
    puVar3 = (uint *)__errno_location();
    uVar1 = *puVar3;
    piVar4 = __errno_location();
    pcVar5 = strerror(*piVar4);
    fprintf(pFVar2,"%s - error number: %d (%s)\n","Failed to set up signal handlers",(ulong)uVar1,
            pcVar5);
    exit(1);
  }
  tester_mq_get_name_from_pid(main_pid,tester_mq_name);
  tester_mq = tester_mq_start(true,tester_mq_name,&err);
  pFVar2 = _stderr;
  if ((err & 1U) != 0) {
    puVar3 = (uint *)__errno_location();
    uVar1 = *puVar3;
    piVar4 = __errno_location();
    pcVar5 = strerror(*piVar4);
    fprintf(pFVar2,"%s - error number: %d (%s)\n","Failed to start tester mq",(ulong)uVar1,pcVar5);
    exit(1);
  }
  async_spawn_sender();
  close(0);
  printf("PID: %d\n",(ulong)(uint)main_pid);
  while ((rcd_completed & 1U) == 0 || comm_summary.rcd < expected_rcd) {
    tester_mq_receive(tester_mq,(tester_mq_msg *)local_410,&err);
    pFVar2 = _stderr;
    if ((err & 1U) != 0) {
      puVar3 = (uint *)__errno_location();
      uVar1 = *puVar3;
      piVar4 = __errno_location();
      pcVar5 = strerror(*piVar4);
      fprintf(pFVar2,"%s - error number: %d (%s)\n","Failed to receive message from tester mq",
              (ulong)uVar1,pcVar5);
      err_sig_other_and_exit();
    }
    process_msg((tester_mq_msg *)local_410);
  }
  tester_mq_finish(true,tester_mq,tester_mq_name,&err);
  pFVar2 = _stderr;
  if ((err & 1U) != 0) {
    puVar3 = (uint *)__errno_location();
    uVar1 = *puVar3;
    piVar4 = __errno_location();
    pcVar5 = strerror(*piVar4);
    fprintf(pFVar2,"%s - error number: %d (%s)\n","Failed to finish tester mq in main process",
            (ulong)uVar1,pcVar5);
    err_sig_other_and_exit();
  }
  collect_sender(&err);
  pFVar2 = _stderr;
  if ((err & 1U) != 0) {
    puVar3 = (uint *)__errno_location();
    uVar1 = *puVar3;
    piVar4 = __errno_location();
    pcVar5 = strerror(*piVar4);
    fprintf(pFVar2,"%s - error number: %d (%s)\n","Unexpected fail while collecting message sender",
            (ulong)uVar1,pcVar5);
    exit(1);
  }
  print_comm_summary(&comm_summary,false);
  return 0;
}

Assistant:

int main() {
    assert(err == false);
    // initial setup
    main_pid = getpid();
    setup_sig_handlers(&err);
    HANDLE_ERR_EXIT_WITH_MSG("Failed to set up signal handlers");

    // setup queues
    tester_mq_get_name_from_pid(main_pid, tester_mq_name);
    tester_mq = tester_mq_start(true, tester_mq_name, &err);
    HANDLE_ERR_EXIT_WITH_MSG("Failed to start tester mq");

    // create process for processing and sending words
    async_spawn_sender();
    close(0); // prevent any possible data races in input

    printf("PID: %d\n", main_pid);
    // process validator responses
    tester_mq_msg tester_msg;
    while(!rcd_completed || comm_summary.rcd < expected_rcd) {
        tester_mq_receive(tester_mq, &tester_msg, &err);
        HANDLE_ERR_WITH_MSG(err_sig_other_and_exit, "Failed to receive message from tester mq");

        process_msg(&tester_msg);
    }
    tester_mq_finish(true, tester_mq, tester_mq_name, &err);
    HANDLE_ERR_WITH_MSG(err_sig_other_and_exit, "Failed to finish tester mq in main process");

    // clean up
    collect_sender(&err);
    HANDLE_ERR_EXIT_WITH_MSG("Unexpected fail while collecting message sender");
    print_comm_summary(&comm_summary, false);
    return 0;
}